

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlNewProp(xmlNodePtr node,xmlChar *name,xmlChar *value)

{
  xmlChar *value_local;
  xmlChar *name_local;
  xmlNodePtr node_local;
  
  if (name == (xmlChar *)0x0) {
    node_local = (xmlNodePtr)0x0;
  }
  else {
    node_local = (xmlNodePtr)xmlNewPropInternal(node,(xmlNsPtr)0x0,name,value,0);
  }
  return (xmlAttrPtr)node_local;
}

Assistant:

xmlAttrPtr
xmlNewProp(xmlNodePtr node, const xmlChar *name, const xmlChar *value) {

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewProp : name == NULL\n");
#endif
	return(NULL);
    }

	return xmlNewPropInternal(node, NULL, name, value, 0);
}